

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O1

vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> * __thiscall
anon_unknown.dwarf_37229c::CliqueRunner::unpermute_and_finish
          (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
           *__return_storage_ptr__,CliqueRunner *this,vector<int,_std::allocator<int>_> *v)

{
  int *piVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  long lVar5;
  int *w;
  int *piVar6;
  bool local_2e;
  bool local_2d;
  int local_2c;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar6 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar6 != piVar1) {
    do {
      local_2d = true;
      std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::emplace_back<int&,bool>
                ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)
                 __return_storage_ptr__,
                 (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + *piVar6,&local_2d);
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar1);
  }
  local_2c = 0;
  if (0 < this->size) {
    do {
      ppVar4 = (__return_storage_ptr__->
               super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (__return_storage_ptr__->
               super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      lVar5 = (long)ppVar2 - (long)ppVar4 >> 5;
      ppVar3 = ppVar4;
      if (0 < lVar5) {
        ppVar3 = (pointer)((long)&ppVar4->first +
                          ((long)ppVar2 - (long)ppVar4 & 0xffffffffffffffe0U));
        lVar5 = lVar5 + 1;
        ppVar4 = ppVar4 + 2;
        do {
          if (ppVar4[-2].first == local_2c) {
            ppVar4 = ppVar4 + -2;
            goto LAB_00172493;
          }
          if (ppVar4[-1].first == local_2c) {
            ppVar4 = ppVar4 + -1;
            goto LAB_00172493;
          }
          if (ppVar4->first == local_2c) goto LAB_00172493;
          if (ppVar4[1].first == local_2c) {
            ppVar4 = ppVar4 + 1;
            goto LAB_00172493;
          }
          lVar5 = lVar5 + -1;
          ppVar4 = ppVar4 + 4;
        } while (1 < lVar5);
      }
      lVar5 = (long)ppVar2 - (long)ppVar3 >> 3;
      if (lVar5 == 1) {
LAB_00172478:
        ppVar4 = ppVar3;
        if (ppVar3->first != local_2c) {
          ppVar4 = ppVar2;
        }
      }
      else if (lVar5 == 2) {
LAB_00172470:
        ppVar4 = ppVar3;
        if (ppVar3->first != local_2c) {
          ppVar3 = ppVar3 + 1;
          goto LAB_00172478;
        }
      }
      else {
        ppVar4 = ppVar2;
        if ((lVar5 == 3) && (ppVar4 = ppVar3, ppVar3->first != local_2c)) {
          ppVar3 = ppVar3 + 1;
          goto LAB_00172470;
        }
      }
LAB_00172493:
      if (ppVar2 == ppVar4) {
        local_2e = false;
        std::vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>>::
        emplace_back<int&,bool>
                  ((vector<std::pair<int,bool>,std::allocator<std::pair<int,bool>>> *)
                   __return_storage_ptr__,&local_2c,&local_2e);
      }
      local_2c = local_2c + 1;
    } while (local_2c < this->size);
  }
  return __return_storage_ptr__;
}

Assistant:

auto unpermute_and_finish(
            vector<int> & v) -> vector<pair<int, bool>>
        {
            vector<pair<int, bool>> result;
            for (auto & w : v)
                result.emplace_back(order[w], true);
            for (int w = 0; w < size; ++w)
                if (result.end() == find_if(result.begin(), result.end(), [&](auto & x) { return x.first == w; }))
                    result.emplace_back(w, false);
            return result;
        }